

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O1

void update_map(Integer **top,Integer **list,Integer **idx,Integer **jdx,void **data,Integer idim,
               Integer jdim,Integer elemsize,Integer *bufsize,Integer *ncnt)

{
  long lVar1;
  long lVar2;
  Integer *pIVar3;
  Integer *pIVar4;
  Integer *pIVar5;
  void *pvVar6;
  Integer *pIVar7;
  long lVar8;
  long lVar9;
  Integer *pIVar10;
  Integer *__s;
  void *pvVar11;
  Integer *pIVar12;
  Integer *pIVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  size_t __size;
  void *__dest;
  long lVar17;
  
  lVar2 = *bufsize;
  lVar1 = lVar2 * 2;
  __size = lVar2 << 4;
  pIVar10 = (Integer *)malloc(__size);
  __s = (Integer *)malloc(__size);
  pvVar11 = malloc(lVar1 * elemsize);
  if (0 < lVar2) {
    lVar16 = 1;
    if (1 < lVar1) {
      lVar16 = lVar1;
    }
    memset(__s,0xff,lVar16 << 3);
  }
  pIVar12 = (Integer *)malloc(__size);
  pIVar13 = (Integer *)malloc(__size);
  if (lVar2 < 1) {
    lVar16 = 0;
  }
  else {
    pIVar3 = *top;
    lVar16 = 0;
    lVar14 = 0;
    do {
      lVar17 = pIVar3[lVar14];
      if (-1 < lVar17) {
        pIVar4 = *idx;
        pIVar5 = *jdx;
        pvVar6 = *data;
        pIVar7 = *list;
        __dest = (void *)(elemsize * lVar16 + (long)pvVar11);
        do {
          lVar8 = pIVar4[lVar17];
          lVar9 = pIVar5[lVar17];
          lVar15 = (lVar8 * jdim + lVar9) % lVar1;
          __s[lVar16] = pIVar10[lVar15];
          pIVar10[lVar15] = lVar16;
          pIVar12[lVar16] = lVar8;
          pIVar13[lVar16] = lVar9;
          memcpy(__dest,(void *)(lVar17 * elemsize + (long)pvVar6),elemsize);
          lVar16 = lVar16 + 1;
          lVar17 = pIVar7[lVar17];
          __dest = (void *)((long)__dest + elemsize);
        } while (-1 < lVar17);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != lVar2);
  }
  free(*top);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = lVar1;
  *top = pIVar10;
  *list = __s;
  *idx = pIVar12;
  *jdx = pIVar13;
  *data = pvVar11;
  *ncnt = lVar16;
  return;
}

Assistant:

void update_map(Integer **top, Integer **list, Integer **idx, Integer **jdx,
    void **data, Integer idim, Integer jdim, Integer elemsize,
    Integer *bufsize, Integer *ncnt)
{
  Integer *ttop;
  Integer *tlist;
  Integer *tidx, *tjdx;
  Integer lcnt;
  Integer newsize;
  void *tdata;
  char *nptr;
  char *optr;
  Integer ii,jj;
  newsize = 2*(*bufsize);
  ttop = (Integer*)malloc(newsize*sizeof(Integer));
  tlist = (Integer*)malloc(newsize*sizeof(Integer));
  tdata = malloc(newsize*elemsize);
  lcnt = 0;
  for (ii=0; ii<newsize; ii++) tlist[ii] = -1;
  tidx = (Integer*)malloc(newsize*sizeof(Integer));
  tjdx = (Integer*)malloc(newsize*sizeof(Integer));
  for (ii=0; ii<*bufsize; ii++) {
    jj = (*top)[ii];
    while (jj >= 0) {
      Integer itmp = (*idx)[jj];
      Integer jtmp = (*jdx)[jj];
      Integer index = (jdim*itmp + jtmp)%newsize;
      tlist[lcnt] = ttop[index];
      ttop[index] = lcnt;
      tidx[lcnt] = itmp; 
      tjdx[lcnt] = jtmp; 
      nptr = (char*)tdata + lcnt*elemsize;
      optr = (char*)(*data) + jj*elemsize;
      memcpy(nptr,optr,elemsize);
      jj = (*list)[jj];
      lcnt++;
    }
  }
  free(*top);
  free(*list);
  free(*idx);
  free(*jdx);
  free(*data);
  *bufsize = newsize;
  *top = ttop;
  *list = tlist;
  *idx = tidx;
  *jdx = tjdx;
  *data = tdata;
  *ncnt = lcnt;
}